

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h5(disp *this,string *s1,string *s2,string *s3,string *s4,string *s5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  undefined4 in_stack_fffffffffffffea4;
  char in_stack_fffffffffffffeaf;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [80];
  
  std::operator+(in_stack_fffffffffffffeaf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,0x3a));
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  return;
}

Assistant:

void h5(std::string s1,std::string s2,std::string s3,std::string s4,std::string s5)
	{ v_ = ':'+s1+':'+s2+':'+s3+':'+s4+':'+s5; }